

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O3

void borg_delete_take(wchar_t i)

{
  borg_take *pbVar1;
  char *what;
  
  if (borg_takes[i].kind != (object_kind *)0x0) {
    pbVar1 = borg_takes + i;
    if (*borg_cfg != 0) {
      what = format("# Forgetting an object \'%s\' at (%d,%d)",(borg_takes[i].kind)->name,
                    (ulong)pbVar1->y,(ulong)pbVar1->x);
      borg_note(what);
    }
    borg_grids[pbVar1->y][pbVar1->x].take = '\0';
    pbVar1->kind = (object_kind *)0x0;
    pbVar1->known = false;
    pbVar1->seen = false;
    pbVar1->extra = false;
    pbVar1->orbed = false;
    pbVar1->x = '\0';
    pbVar1->y = '\0';
    pbVar1->when = 0;
    pbVar1->value = L'\0';
    pbVar1->tval = L'\0';
    borg_takes_cnt = borg_takes_cnt + -1;
    if (borg.goal.type == 2) {
      borg.goal.type = 0;
    }
  }
  return;
}

Assistant:

void borg_delete_take(int i)
{
    borg_grid *ag;

    borg_take *take = &borg_takes[i];

    /* Paranoia -- Already wiped */
    if (!take->kind)
        return;

    /* Note */
    if (borg_cfg[BORG_VERBOSE])
        borg_note(format("# Forgetting an object '%s' at (%d,%d)",
            (take->kind->name), take->y, take->x));

    /* Access the grid */
    ag = &borg_grids[take->y][take->x];

    /* Forget it */
    ag->take = 0;

    /* Kill the object */
    memset(take, 0, sizeof(borg_take));

    /* One less object */
    borg_takes_cnt--;

    /* Wipe goals */
    if (borg.goal.type == GOAL_TAKE)
        borg.goal.type = 0;
}